

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_builder.cc
# Opt level: O2

void __thiscall
leveldb::TableBuilder::WriteBlock(TableBuilder *this,BlockBuilder *block,BlockHandle *handle)

{
  Rep *pRVar1;
  bool bVar2;
  CompressionType type;
  Slice SVar3;
  Slice block_contents;
  Slice local_30;
  
  bVar2 = ok(this);
  if (bVar2) {
    pRVar1 = this->rep_;
    SVar3 = BlockBuilder::Finish(block);
    local_30 = (Slice)ZEXT816(0x14ba77);
    type = (pRVar1->options).compression;
    if (type < 2) {
      type = kNoCompression;
      local_30 = SVar3;
    }
    WriteRawBlock(this,&local_30,type,handle);
    (pRVar1->compressed_output)._M_string_length = 0;
    *(pRVar1->compressed_output)._M_dataplus._M_p = '\0';
    BlockBuilder::Reset(block);
    return;
  }
  __assert_fail("ok()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/table/table_builder.cc"
                ,0x92,"void leveldb::TableBuilder::WriteBlock(BlockBuilder *, BlockHandle *)");
}

Assistant:

void TableBuilder::WriteBlock(BlockBuilder* block, BlockHandle* handle) {
  // File format contains a sequence of blocks where each block has:
  //    block_data: uint8[n]
  //    type: uint8
  //    crc: uint32
  assert(ok());
  Rep* r = rep_;
  Slice raw = block->Finish();

  Slice block_contents;
  CompressionType type = r->options.compression;
  // TODO(postrelease): Support more compression options: zlib?
  switch (type) {
    case kNoCompression:
      block_contents = raw;
      break;

    case kSnappyCompression: {
      std::string* compressed = &r->compressed_output;
      if (port::Snappy_Compress(raw.data(), raw.size(), compressed) &&
          compressed->size() < raw.size() - (raw.size() / 8u)) {
        block_contents = *compressed;
      } else {
        // Snappy not supported, or compressed less than 12.5%, so just
        // store uncompressed form
        block_contents = raw;
        type = kNoCompression;
      }
      break;
    }
  }
  WriteRawBlock(block_contents, type, handle);
  r->compressed_output.clear();
  block->Reset();
}